

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall iDynTree::Model::Model(Model *this)

{
  this->_vptr_Model = (_func_int **)&PTR__Model_001852f0;
  memset(&this->links,0,0xd8);
  this->defaultBaseLink = LINK_INVALID_INDEX;
  this->nrOfPosCoords = 0;
  this->nrOfDOFs = 0;
  ModelSolidShapes::ModelSolidShapes(&this->m_visualSolidShapes);
  ModelSolidShapes::ModelSolidShapes(&this->m_collisionSolidShapes);
  SensorsList::SensorsList(&this->m_sensors);
  return;
}

Assistant:

Model::Model()
    : defaultBaseLink(LINK_INVALID_INDEX)
    , nrOfPosCoords(0)
    , nrOfDOFs(0)
{

}